

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * __thiscall
fmt::v7::detail::
format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
::on_format_specs(format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *this,int id,char *begin,char *end)

{
  basic_format_parse_context<char,_fmt::v7::detail::error_handler> *pbVar1;
  size_t *psVar2;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *this_00;
  undefined1 value [16];
  undefined1 value_00 [16];
  handle handle;
  basic_string_view<char> value_01;
  basic_format_specs<char> specs_00;
  basic_format_specs<char> specs_01;
  basic_format_specs<char> specs_02;
  context_type *pcVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  unkbyte10 in_stack_ffffffffffffff08;
  undefined6 in_stack_ffffffffffffff12;
  specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
  local_e0;
  char_spec_handler local_b8;
  char *local_a8;
  context_type *local_a0;
  arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> local_98;
  undefined1 auStack_68 [8];
  format_arg arg;
  undefined1 local_40 [8];
  basic_format_specs<char> specs;
  
  pcVar6 = (this->parse_context).format_str_.data_;
  lVar4 = (long)begin - (long)pcVar6;
  local_a8 = end;
  if (-1 < lVar4) {
    pbVar1 = &this->parse_context;
    pcVar6 = pcVar6 + lVar4;
    (this->parse_context).format_str_.data_ = pcVar6;
    psVar2 = &(this->parse_context).format_str_.size_;
    *psVar2 = *psVar2 - lVar4;
    this_00 = &this->context;
    get_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,int>
              ((format_arg *)auStack_68,(detail *)this_00,
               (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)(ulong)(uint)id
               ,(int)pcVar6);
    pcVar6 = local_a8;
    if (arg.value_.field_0.int128_value._8_4_ == 0xf) {
      (*(code *)CONCAT62(arg.value_.field_0.long_long_value._2_6_,arg.value_.field_0.int_value._0_2_
                        ))(CONCAT44(auStack_68._4_4_,auStack_68._0_4_),pbVar1,this_00);
      pcVar5 = (pbVar1->format_str_).data_;
    }
    else {
      local_40._0_4_ = 0;
      local_40._4_4_ = -1;
      specs.width._0_2_ = 0;
      specs.precision._2_1_ = 1;
      specs._2_4_ = 0x20;
      local_e0.checker_.error_handler_ =
           &local_e0.
            super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ;
      local_e0.checker_.arg_type_ = arg.value_.field_0.int128_value._8_4_;
      local_e0.
      super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .super_specs_setter<char>.specs_ = (basic_format_specs<char> *)local_40;
      local_e0.
      super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .parse_context_ = pbVar1;
      local_e0.
      super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .context_ = this_00;
      local_a0 = this_00;
      pcVar5 = parse_format_specs<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&>
                         (begin,local_a8,
                          (specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
                           *)local_e0.checker_.error_handler_);
      pcVar3 = local_a0;
      if ((pcVar5 == pcVar6) || (*pcVar5 != '}')) {
        error_handler::on_error((error_handler *)begin,"missing \'}\' in format string");
      }
      pcVar6 = (pbVar1->format_str_).data_;
      lVar4 = (long)pcVar5 - (long)pcVar6;
      if (lVar4 < 0) goto LAB_00249375;
      (this->parse_context).format_str_.data_ = pcVar6 + lVar4;
      psVar2 = &(this->parse_context).format_str_.size_;
      *psVar2 = *psVar2 - lVar4;
      local_98.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (this->context).out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
      ;
      local_98.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .locale_.locale_ = (this->context).loc_.locale_;
      local_98.ctx_ = local_a0;
      local_98.ptr_ = (char *)0x0;
      local_98.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .specs_ = (basic_format_specs<char> *)local_40;
      local_98.parse_ctx_ = pbVar1;
      switch(arg.value_.field_0.int128_value._8_4_) {
      case 1:
        arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        ::write_int<int>(&local_98.
                          super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                         ,auStack_68._0_4_,(format_specs *)local_40);
        break;
      case 2:
        arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        ::write_int<unsigned_int>
                  (&local_98.
                    super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                   ,auStack_68._0_4_,(format_specs *)local_40);
        break;
      case 3:
        arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        ::write_int<long_long>
                  (&local_98.
                    super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                   ,CONCAT44(auStack_68._4_4_,auStack_68._0_4_),(format_specs *)local_40);
        break;
      case 4:
        arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        ::write_int<unsigned_long_long>
                  (&local_98.
                    super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                   ,CONCAT44(auStack_68._4_4_,auStack_68._0_4_),(format_specs *)local_40);
        break;
      case 5:
        value._10_6_ = in_stack_ffffffffffffff12;
        value._0_10_ = in_stack_ffffffffffffff08;
        arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        ::write_int<__int128>
                  (&local_98.
                    super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                   ,(__int128)value,(format_specs *)CONCAT44(auStack_68._4_4_,auStack_68._0_4_));
        break;
      case 6:
        value_00._10_6_ = in_stack_ffffffffffffff12;
        value_00._0_10_ = in_stack_ffffffffffffff08;
        arg_formatter_base<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::error_handler>
        ::write_int<unsigned__int128>
                  ((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::error_handler>
                    *)&local_98,(unsigned___int128)value_00,
                   (format_specs *)CONCAT44(auStack_68._4_4_,auStack_68._0_4_));
        break;
      case 7:
        local_98.
        super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        .out_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                ::operator()(&local_98.
                              super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                             ,(bool)auStack_68[0]);
        break;
      case 8:
        local_b8.formatter =
             &local_98.
              super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        ;
        local_b8.value = auStack_68[0];
        handle_char_specs<char,fmt::v7::detail::arg_formatter_base<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::error_handler>::char_spec_handler>
                  ((basic_format_specs<char> *)local_40,&local_b8);
        break;
      case 9:
        specs_02._8_2_ = (undefined2)specs.width;
        specs_02.width = local_40._0_4_;
        specs_02.precision = local_40._4_4_;
        specs_02.fill.data_ = (char  [4])specs._2_4_;
        specs_02.fill.size_ = specs.precision._2_1_;
        specs_02._15_1_ = specs.precision._3_1_;
        local_98.
        super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
             write<char,_fmt::v7::detail::buffer_appender<char>,_float,_0>
                       ((buffer_appender<char>)
                        local_98.
                        super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                        .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                        (float)auStack_68._0_4_,specs_02,
                        local_98.
                        super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                        .locale_);
        break;
      case 10:
        specs_00._8_2_ = (undefined2)specs.width;
        specs_00.width = local_40._0_4_;
        specs_00.precision = local_40._4_4_;
        specs_00.fill.data_ = (char  [4])specs._2_4_;
        specs_00.fill.size_ = specs.precision._2_1_;
        specs_00._15_1_ = specs.precision._3_1_;
        local_98.
        super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
             write<char,_fmt::v7::detail::buffer_appender<char>,_double,_0>
                       ((buffer_appender<char>)
                        local_98.
                        super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                        .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                        (double)CONCAT44(auStack_68._4_4_,auStack_68._0_4_),specs_00,
                        local_98.
                        super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                        .locale_);
        break;
      case 0xb:
        specs_01._8_2_ = (undefined2)specs.width;
        specs_01.width = local_40._0_4_;
        specs_01.precision = local_40._4_4_;
        specs_01.fill.data_ = (char  [4])specs._2_4_;
        specs_01.fill.size_ = specs.precision._2_1_;
        specs_01._15_1_ = specs.precision._3_1_;
        local_98.
        super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
             write<char,_fmt::v7::detail::buffer_appender<char>,_long_double,_0>
                       ((buffer_appender<char>)
                        local_98.
                        super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                        .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                        (longdouble)
                        CONCAT28(arg.value_.field_0.int_value._0_2_,
                                 CONCAT44(auStack_68._4_4_,auStack_68._0_4_)),specs_01,
                        local_98.
                        super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                        .locale_);
        break;
      case 0xc:
        local_98.
        super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        .out_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                ::operator()(&local_98.
                              super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                             ,(char *)CONCAT44(auStack_68._4_4_,auStack_68._0_4_));
        break;
      case 0xd:
        value_01.data_._4_4_ = auStack_68._4_4_;
        value_01.data_._0_4_ = auStack_68._0_4_;
        value_01.size_._0_2_ = arg.value_.field_0.int_value._0_2_;
        value_01.size_._2_6_ = arg.value_.field_0.long_long_value._2_6_;
        local_98.
        super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        .out_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                ::operator()(&local_98.
                              super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                             ,value_01);
        break;
      case 0xe:
        local_98.
        super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        .out_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                ::operator()(&local_98.
                              super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                             ,(void *)CONCAT44(auStack_68._4_4_,auStack_68._0_4_));
        break;
      case 0xf:
        handle.custom_.value._4_4_ = auStack_68._4_4_;
        handle.custom_.value._0_4_ = auStack_68._0_4_;
        handle.custom_.format._0_2_ = arg.value_.field_0.int_value._0_2_;
        handle.custom_.format._2_6_ = arg.value_.field_0.long_long_value._2_6_;
        local_98.
        super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
             arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>::operator()
                       (&local_98,handle);
        break;
      default:
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format.h"
                    ,0x7bd,"invalid argument type");
      }
      (pcVar3->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (buffer<char> *)
           local_98.
           super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
    }
    return pcVar5;
  }
LAB_00249375:
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/core.h"
              ,0x13c,"negative value");
}

Assistant:

const Char* on_format_specs(int id, const Char* begin, const Char* end) {
    advance_to(parse_context, begin);
    auto arg = get_arg(context, id);
    custom_formatter<Context> f(parse_context, context);
    if (visit_format_arg(f, arg)) return parse_context.begin();
    basic_format_specs<Char> specs;
    using parse_context_t = basic_format_parse_context<Char>;
    specs_checker<specs_handler<parse_context_t, Context>> handler(
        specs_handler<parse_context_t, Context>(specs, parse_context, context),
        arg.type());
    begin = parse_format_specs(begin, end, handler);
    if (begin == end || *begin != '}') on_error("missing '}' in format string");
    advance_to(parse_context, begin);
    context.advance_to(
        visit_format_arg(ArgFormatter(context, &parse_context, &specs), arg));
    return begin;
  }